

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

ComplexTypeInfo * __thiscall
xercesc_4_0::TraverseSchema::getElementComplexTypeInfo
          (TraverseSchema *this,DOMElement *elem,XMLCh *typeStr,XMLCh *otherSchemaURI)

{
  ulong uVar1;
  short *psVar2;
  XMLCh XVar3;
  XMLStringPool *pXVar4;
  ValueVectorOf<int> *pVVar5;
  _func_int **pp_Var6;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *pRVar7;
  SchemaInfo *pSVar8;
  RefVectorOf<xercesc_4_0::SchemaInfo> *pRVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Grammar *pGVar16;
  ulong uVar17;
  DOMElement *elem_00;
  undefined4 extraout_var_01;
  SchemaInfo *toRestore;
  ListType aListType;
  XMLSize_t XVar18;
  RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *pRVar19;
  ComplexTypeInfo *pCVar20;
  long *plVar21;
  XMLCh *pXVar22;
  ulong uVar23;
  XMLCh XVar24;
  XMLBuffer *pXVar25;
  XMLCh *pXVar26;
  XMLCh *pXVar27;
  XMLBuffer buffCopy;
  SchemaInfo **local_90;
  SchemaInfo *local_88;
  XMLBuffer local_80;
  XMLBuffer *local_48;
  XMLSize_t local_40;
  XMLCh *local_38;
  
  iVar13 = XMLString::indexOf(typeStr,L':');
  XVar18 = 0;
  if (typeStr != (XMLCh *)0x0) {
    do {
      psVar2 = (short *)((long)typeStr + XVar18);
      XVar18 = XVar18 + 2;
    } while (*psVar2 != 0);
    XVar18 = ((long)XVar18 >> 1) - 1;
  }
  pXVar27 = L"";
  pXVar26 = L"";
  if (XVar18 != (long)(iVar13 + 1)) {
    pXVar25 = &this->fBuffer;
    if (iVar13 == -1) {
      pXVar25->fIndex = 0;
      pXVar26 = typeStr;
    }
    else {
      XVar18 = XVar18 + ~(long)iVar13;
      pXVar25->fIndex = 0;
      pXVar26 = typeStr + (long)iVar13 + 1;
    }
    XMLBuffer::append(pXVar25,pXVar26,XVar18);
    pXVar4 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar14 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[5])(pXVar4);
    iVar13 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[10])(pXVar4,(ulong)uVar14);
    pXVar26 = (XMLCh *)CONCAT44(extraout_var,iVar13);
  }
  iVar13 = XMLString::indexOf(typeStr,L':');
  if (1 < iVar13 + 1U) {
    (this->fBuffer).fIndex = 0;
    XMLBuffer::append(&this->fBuffer,typeStr,(long)iVar13);
    pXVar4 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar14 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[5])(pXVar4);
    iVar13 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[10])(pXVar4,(ulong)uVar14);
    pXVar27 = (XMLCh *)CONCAT44(extraout_var_00,iVar13);
  }
  if (otherSchemaURI == (XMLCh *)0x0) {
    pXVar27 = resolvePrefixToURI(this,elem,pXVar27);
    local_88 = this->fSchemaInfo;
    uVar14 = this->fCurrentScope;
    (this->fBuffer).fIndex = 0;
    if (pXVar27 != (XMLCh *)0x0) goto LAB_0032dfa4;
    bVar11 = true;
    XVar18 = 0;
    pXVar27 = (XMLCh *)0x0;
  }
  else {
    local_88 = this->fSchemaInfo;
    uVar14 = this->fCurrentScope;
    (this->fBuffer).fIndex = 0;
    pXVar27 = otherSchemaURI;
LAB_0032dfa4:
    if (*pXVar27 == L'\0') {
      XVar18 = 0;
    }
    else {
      XMLBuffer::append(&this->fBuffer,pXVar27);
      XVar18 = (this->fBuffer).fIndex;
    }
    bVar11 = false;
  }
  local_90 = &this->fSchemaInfo;
  pXVar25 = &this->fBuffer;
  if (XVar18 == (this->fBuffer).fCapacity) {
    XMLBuffer::ensureCapacity(pXVar25,1);
    XVar18 = pXVar25->fIndex;
  }
  pXVar25->fIndex = XVar18 + 1;
  (this->fBuffer).fBuffer[XVar18] = L',';
  local_38 = pXVar26;
  XMLBuffer::append(pXVar25,pXVar26);
  if (otherSchemaURI == (XMLCh *)0x0) {
    pRVar7 = this->fComplexTypeRegistry;
    pXVar26 = (this->fBuffer).fBuffer;
    pXVar26[(this->fBuffer).fIndex] = L'\0';
    uVar17 = (ulong)(ushort)*pXVar26;
    if (uVar17 == 0) {
      uVar17 = 0;
    }
    else {
      XVar24 = pXVar26[1];
      if (XVar24 != L'\0') {
        pXVar22 = pXVar26 + 2;
        do {
          uVar17 = (ulong)(ushort)XVar24 + (uVar17 >> 0x18) + uVar17 * 0x26;
          XVar24 = *pXVar22;
          pXVar22 = pXVar22 + 1;
        } while (XVar24 != L'\0');
      }
      uVar17 = uVar17 % pRVar7->fHashModulus;
    }
    pRVar19 = pRVar7->fBucketList[uVar17];
    aListType = INCLUDE;
    if (pRVar19 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0) {
      do {
        bVar12 = StringHasher::equals((StringHasher *)&pRVar7->field_0x30,pXVar26,pRVar19->fKey);
        if (bVar12) {
          pCVar20 = pRVar19->fData;
          aListType = INCLUDE;
          if (pCVar20 != (ComplexTypeInfo *)0x0) goto LAB_0032e3c0;
          goto LAB_0032e1d8;
        }
        pRVar19 = pRVar19->fNext;
      } while (pRVar19 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0);
      aListType = INCLUDE;
    }
  }
  else {
    iVar13 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])();
    pVVar5 = this->fImportedNSList;
    if ((pVVar5 == (ValueVectorOf<int> *)0x0) || (uVar17 = pVVar5->fCurCount, uVar17 == 0)) {
      return (ComplexTypeInfo *)0x0;
    }
    if (*pVVar5->fElemList != iVar13) {
      uVar23 = 0;
      do {
        if (uVar17 - 1 == uVar23) {
          return (ComplexTypeInfo *)0x0;
        }
        uVar1 = uVar23 + 1;
        lVar10 = uVar23 + 1;
        uVar23 = uVar1;
      } while (pVVar5->fElemList[lVar10] != iVar13);
      if (uVar17 <= uVar1) {
        return (ComplexTypeInfo *)0x0;
      }
    }
    pGVar16 = GrammarResolver::getGrammar(this->fGrammarResolver,pXVar27);
    if (pGVar16 == (Grammar *)0x0) {
      return (ComplexTypeInfo *)0x0;
    }
    iVar15 = (*(pGVar16->super_XSerializable)._vptr_XSerializable[5])(pGVar16);
    if (iVar15 != 1) {
      return (ComplexTypeInfo *)0x0;
    }
    pp_Var6 = pGVar16[7].super_XSerializable._vptr_XSerializable;
    pXVar26 = (this->fBuffer).fBuffer;
    pXVar26[pXVar25->fIndex] = L'\0';
    uVar17 = (ulong)(ushort)*pXVar26;
    if (uVar17 == 0) {
      uVar17 = 0;
    }
    else {
      XVar24 = pXVar26[1];
      if (XVar24 != L'\0') {
        pXVar22 = pXVar26 + 2;
        do {
          uVar17 = (ulong)(ushort)XVar24 + (uVar17 >> 0x18) + uVar17 * 0x26;
          XVar24 = *pXVar22;
          pXVar22 = pXVar22 + 1;
        } while (XVar24 != L'\0');
      }
      uVar17 = uVar17 % (ulong)pp_Var6[3];
    }
    plVar21 = *(long **)(pp_Var6[2] + uVar17 * 8);
    local_48 = pXVar25;
    if (plVar21 != (long *)0x0) {
      do {
        bVar12 = StringHasher::equals((StringHasher *)(pp_Var6 + 6),pXVar26,(void *)plVar21[2]);
        if (bVar12) {
          if ((ComplexTypeInfo *)*plVar21 != (ComplexTypeInfo *)0x0) {
            return (ComplexTypeInfo *)*plVar21;
          }
          break;
        }
        plVar21 = (long *)plVar21[1];
      } while (plVar21 != (long *)0x0);
    }
    pSVar8 = *local_90;
    pRVar9 = pSVar8->fImportedInfoList;
    if (pRVar9 == (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
      return (ComplexTypeInfo *)0x0;
    }
    local_40 = (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount;
    if (local_40 == 0) {
      return (ComplexTypeInfo *)0x0;
    }
    XVar18 = 0;
    while (toRestore = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                                 (&pSVar8->fImportedInfoList->
                                   super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,XVar18),
          toRestore->fTargetNSURI != iVar13) {
      XVar18 = XVar18 + 1;
      if (local_40 == XVar18) {
        return (ComplexTypeInfo *)0x0;
      }
    }
    if (toRestore->fProcessed != false) {
      return (ComplexTypeInfo *)0x0;
    }
    restoreSchemaInfo(this,toRestore,IMPORT,0xfffffffe);
    aListType = IMPORT;
    pXVar25 = local_48;
  }
LAB_0032e1d8:
  if (pXVar27 == L"http://www.w3.org/2001/XMLSchema") {
LAB_0032e1fa:
    pXVar26 = this->fTargetNSURIString;
    if (pXVar26 != L"http://www.w3.org/2001/XMLSchema") {
      pXVar27 = L"http://www.w3.org/2001/XMLSchema";
      if (pXVar26 != (XMLCh *)0x0) {
        pCVar20 = (ComplexTypeInfo *)0x0;
        do {
          XVar24 = *pXVar26;
          if (XVar24 == L'\0') goto LAB_0032e257;
          pXVar26 = pXVar26 + 1;
          XVar3 = *pXVar27;
          pXVar27 = pXVar27 + 1;
        } while (XVar24 == XVar3);
        goto LAB_0032e3c0;
      }
LAB_0032e257:
      if (*pXVar27 != L'\0') {
        pCVar20 = (ComplexTypeInfo *)0x0;
        goto LAB_0032e3c0;
      }
    }
  }
  else if (bVar11) {
    pXVar26 = L"http://www.w3.org/2001/XMLSchema";
LAB_0032e1f4:
    if (*pXVar26 == L'\0') goto LAB_0032e1fa;
  }
  else {
    pXVar26 = L"http://www.w3.org/2001/XMLSchema";
    do {
      XVar24 = *pXVar27;
      if (XVar24 == L'\0') goto LAB_0032e1f4;
      pXVar27 = pXVar27 + 1;
      XVar3 = *pXVar26;
      pXVar26 = pXVar26 + 1;
    } while (XVar24 == XVar3);
  }
  pCVar20 = (ComplexTypeInfo *)0x0;
  elem_00 = SchemaInfo::getTopLevelComponent(*local_90,0,L"complexType",local_38,local_90);
  if (elem_00 != (DOMElement *)0x0) {
    XVar18 = (this->fBuffer).fIndex;
    local_80.fMemoryManager = this->fMemoryManager;
    local_80.fCapacity = XVar18 + 1;
    local_80.fIndex = 0;
    local_80.fFullSize = 0;
    local_80.fUsed = false;
    local_80.fFullHandler = (XMLBufferFullHandler *)0x0;
    iVar13 = (*(local_80.fMemoryManager)->_vptr_MemoryManager[3])
                       (local_80.fMemoryManager,XVar18 * 2 + 4);
    local_80.fBuffer = (XMLCh *)CONCAT44(extraout_var_01,iVar13);
    *local_80.fBuffer = L'\0';
    pXVar26 = pXVar25->fBuffer;
    pXVar26[(this->fBuffer).fIndex] = L'\0';
    local_80.fIndex = 0;
    if (*pXVar26 != L'\0') {
      XMLBuffer::append(&local_80,pXVar26);
    }
    traverseComplexTypeDecl(this,elem_00,true,(XMLCh *)0x0);
    pXVar26 = local_80.fBuffer;
    pRVar7 = this->fComplexTypeRegistry;
    local_80.fBuffer[local_80.fIndex] = L'\0';
    uVar17 = (ulong)(ushort)*local_80.fBuffer;
    if (uVar17 == 0) {
      uVar17 = 0;
    }
    else {
      XVar24 = local_80.fBuffer[1];
      if (XVar24 != L'\0') {
        pXVar27 = local_80.fBuffer + 2;
        do {
          uVar17 = (ulong)(ushort)XVar24 + (uVar17 >> 0x18) + uVar17 * 0x26;
          XVar24 = *pXVar27;
          pXVar27 = pXVar27 + 1;
        } while (XVar24 != L'\0');
      }
      uVar17 = uVar17 % pRVar7->fHashModulus;
    }
    pRVar19 = pRVar7->fBucketList[uVar17];
    if (pRVar19 == (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0) {
      pCVar20 = (ComplexTypeInfo *)0x0;
    }
    else {
      pCVar20 = (ComplexTypeInfo *)0x0;
      do {
        bVar11 = StringHasher::equals((StringHasher *)&pRVar7->field_0x30,pXVar26,pRVar19->fKey);
        if (bVar11) {
          pCVar20 = pRVar19->fData;
          break;
        }
        pRVar19 = pRVar19->fNext;
      } while (pRVar19 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0);
    }
    (*(local_80.fMemoryManager)->_vptr_MemoryManager[4])(local_80.fMemoryManager,local_80.fBuffer);
  }
LAB_0032e3c0:
  restoreSchemaInfo(this,local_88,aListType,uVar14);
  return pCVar20;
}

Assistant:

ComplexTypeInfo*
TraverseSchema::getElementComplexTypeInfo(const DOMElement* const elem,
                                          const XMLCh* const typeStr,
                                          const XMLCh* const otherSchemaURI)
{
    const XMLCh*         localPart = getLocalPart(typeStr);
    const XMLCh*         prefix = getPrefix(typeStr);
    const XMLCh*         typeURI = (otherSchemaURI) ? otherSchemaURI : resolvePrefixToURI(elem, prefix);
    ComplexTypeInfo*     typeInfo = 0;
    SchemaInfo*          saveInfo = fSchemaInfo;
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    unsigned int         saveScope = fCurrentScope;

    fBuffer.set(typeURI);
    fBuffer.append(chComma);
    fBuffer.append(localPart);

    if (otherSchemaURI != 0) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        unsigned int uriId = fURIStringPool->addOrFind(typeURI);

        if (!isImportingNS(uriId))
            return 0;

        Grammar* aGrammar = fGrammarResolver->getGrammar(typeURI);

        if (!aGrammar || aGrammar->getGrammarType() != Grammar::SchemaGrammarType) {
            return 0;
        }

        typeInfo = ((SchemaGrammar*)aGrammar)->getComplexTypeRegistry()->get(fBuffer.getRawBuffer());

        if (typeInfo) {
            return typeInfo;
        }

        SchemaInfo* impInfo = fSchemaInfo->getImportInfo(uriId);

        if (!impInfo || impInfo->getProcessed()) {
            return 0;
        }

        infoType = SchemaInfo::IMPORT;
        restoreSchemaInfo(impInfo, infoType);
    }
    else {
        typeInfo = fComplexTypeRegistry->get(fBuffer.getRawBuffer());
    }

    if (!typeInfo) {
        if (!XMLString::equals(typeURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA) ||
            XMLString::equals(fTargetNSURIString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {

            DOMElement* typeNode = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_ComplexType,
                SchemaSymbols::fgELT_COMPLEXTYPE, localPart, &fSchemaInfo);

            if (typeNode) {
                // fBuffer is reused by traverseComplexTypeDecl, so we have to store its current value
                XMLBuffer buffCopy(fBuffer.getLen()+1, fMemoryManager);
                buffCopy.set(fBuffer.getRawBuffer());
                traverseComplexTypeDecl(typeNode);
                typeInfo =  fComplexTypeRegistry->get(buffCopy.getRawBuffer());
            }
        }
    }

    // restore schema information
    restoreSchemaInfo(saveInfo, infoType, saveScope);
    return typeInfo;
}